

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::RowObjPS::execute(RowObjPS *this,
                   VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *param_4,
                   DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                            *rStatus,bool isOptimal)

{
  uint *puVar1;
  int iVar2;
  undefined8 uVar3;
  pointer pnVar4;
  VarStatus *pVVar5;
  cpp_dec_float<50U,_int,_void> *v;
  cpp_dec_float<50U,_int,_void> *v_00;
  VarStatus VVar6;
  cpp_dec_float<50U,_int,_void> local_68;
  
  v_00 = &(s->val).
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend;
  v = &(x->val).
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  if (&local_68 == v) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_68,v_00);
    if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
      local_68.neg = (bool)(local_68.neg ^ 1);
    }
  }
  else {
    if (&local_68 != v_00) {
      uVar3 = *(undefined8 *)((v_00->data)._M_elems + 8);
      local_68.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_68.data._M_elems._0_8_ = *(undefined8 *)(v_00->data)._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((v_00->data)._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((v_00->data)._M_elems + 4);
      uVar3 = *(undefined8 *)((v_00->data)._M_elems + 6);
      local_68.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_68.exp = v_00->exp;
      local_68.neg = v_00->neg;
      local_68.fpclass = v_00->fpclass;
      local_68.prec_elem = v_00->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_68,v);
  }
  iVar2 = this->m_i;
  pnVar4 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)((long)&pnVar4[iVar2].m_backend.data + 0x20) =
       CONCAT35(local_68.data._M_elems[9]._1_3_,local_68.data._M_elems._32_5_);
  puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = local_68.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_68.data._M_elems[7]._1_3_,local_68.data._M_elems._24_5_);
  *(undefined8 *)&pnVar4[iVar2].m_backend.data = local_68.data._M_elems._0_8_;
  *(undefined8 *)((long)&pnVar4[iVar2].m_backend.data + 8) = local_68.data._M_elems._8_8_;
  pnVar4[iVar2].m_backend.exp = local_68.exp;
  pnVar4[iVar2].m_backend.neg = local_68.neg;
  pnVar4[iVar2].m_backend.fpclass = local_68.fpclass;
  pnVar4[iVar2].m_backend.prec_elem = local_68.prec_elem;
  if (rStatus->data[this->m_i] != BASIC) {
    iVar2 = this->m_j;
    pVVar5 = cStatus->data;
    VVar6 = pVVar5[iVar2];
    if (VVar6 == ON_UPPER) {
      VVar6 = ON_LOWER;
    }
    else if (VVar6 == ON_LOWER) {
      VVar6 = ON_UPPER;
    }
    rStatus->data[this->m_i] = VVar6;
    pVVar5[iVar2] = ZERO;
  }
  return;
}

Assistant:

void SPxMainSM<R>::RowObjPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
                                     VectorBase<R>&,
                                     DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
                                     DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   s[m_i] = s[m_i] - x[m_j];

   assert(rStatus[m_i] != SPxSolverBase<R>::UNDEFINED);
   assert(cStatus[m_j] != SPxSolverBase<R>::UNDEFINED);
   assert(rStatus[m_i] != SPxSolverBase<R>::BASIC || cStatus[m_j] != SPxSolverBase<R>::BASIC);

   SPxOut::debug(this, "RowObjPS: removing slack column {} ({}) for row {} ({}).\n", m_j, cStatus[m_j],
                 m_i, rStatus[m_i]);

   if(rStatus[m_i] != SPxSolverBase<R>::BASIC)
   {
      switch(cStatus[m_j])
      {
      case SPxSolverBase<R>::ON_UPPER:
         rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
         break;

      case SPxSolverBase<R>::ON_LOWER:
         rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;
         break;

      default:
         rStatus[m_i] = cStatus[m_j];
      }

      // otherwise checkBasisDim() may fail
      cStatus[m_j] = SPxSolverBase<R>::ZERO;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      assert(false);
      throw SPxInternalCodeException("XMAISM15 Dimension doesn't match after this step.");
   }

#endif
}